

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O0

void Abc_NtkPrintFinResults(Vec_Wec_t *vClasses)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  Vec_Int_t *p;
  int local_20;
  int Entry;
  int k;
  int i;
  Vec_Int_t *vClass;
  Vec_Wec_t *vClasses_local;
  
  for (Entry = 0; iVar1 = Vec_WecSize(vClasses), Entry < iVar1; Entry = Entry + 1) {
    p = Vec_WecEntry(vClasses,Entry);
    for (local_20 = 1; iVar1 = Vec_IntSize(p), local_20 < iVar1; local_20 = local_20 + 1) {
      uVar2 = Vec_IntEntry(p,local_20);
      uVar3 = Vec_IntEntry(p,0);
      printf("%d %d\n",(ulong)uVar3,(ulong)uVar2);
    }
  }
  return;
}

Assistant:

void Abc_NtkPrintFinResults( Vec_Wec_t * vClasses )
{
    Vec_Int_t * vClass;
    int i, k, Entry;
    Vec_WecForEachLevel( vClasses, vClass, i )
        Vec_IntForEachEntryStart( vClass, Entry, k, 1 )
            printf( "%d %d\n", Vec_IntEntry(vClass, 0), Entry );
}